

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall chrono::ChParticleCloud::VariablesQbSetSpeed(ChParticleCloud *this,double step)

{
  ChAparticle *pCVar1;
  ChAparticle *pCVar2;
  pointer ppCVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double oos;
  double local_d8;
  double dStack_d0;
  double local_c8;
  ChVectorRef *local_c0;
  undefined8 local_b8;
  long local_a8;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  long local_58;
  ChVector<double> local_48;
  
  ppCVar3 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    dVar6 = 1.0 / step;
    uVar4 = 1;
    uVar5 = 0;
    do {
      pCVar1 = ppCVar3[uVar5];
      local_98 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
      local_90 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
      local_88 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
      local_80 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
      local_78 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
      local_70 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
      local_68 = (pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
      ChVariables::Get_qb((ChVectorRef *)&local_60,(ChVariables *)&ppCVar3[uVar5]->variables);
      local_d8 = local_60;
      dStack_d0 = 1.48219693752374e-323;
      local_b8 = 0;
      local_a8 = local_58;
      if (local_58 < 3) {
LAB_00539a55:
        dStack_d0 = 1.48219693752374e-323;
        local_c0 = (ChVectorRef *)&local_60;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      local_c0 = (ChVectorRef *)&local_60;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_d8,(type *)0x0);
      (*(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
        _vptr_ChFrame[7])(pCVar1,&local_48);
      ppCVar3 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar1 = ppCVar3[uVar5];
      ChVariables::Get_qb((ChVectorRef *)&local_60,(ChVariables *)&ppCVar3[uVar5]->variables);
      local_d8 = (double)((long)local_60 + 0x18);
      dStack_d0 = 1.48219693752374e-323;
      local_b8 = 3;
      local_a8 = local_58;
      if (local_58 < 6) goto LAB_00539a55;
      local_c0 = (ChVectorRef *)&local_60;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_d8,(type *)0x0);
      (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                             super_ChFrame<double> + 0x48))(pCVar1,&local_48);
      if ((step != 0.0) || (NAN(step))) {
        ppCVar3 = (this->particles).
                  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar1 = ppCVar3[uVar5];
        pCVar2 = ppCVar3[uVar5];
        local_d8 = dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.
                            m_data[0] - local_98);
        dStack_d0 = dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos
                             .m_data[1] - local_90);
        local_c8 = dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.
                            m_data[2] - local_88);
        (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                               super_ChFrame<double> + 0x60))
                  (pCVar1,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                           *)&local_d8);
        ppCVar3 = (this->particles).
                  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar1 = ppCVar3[uVar5];
        pCVar2 = ppCVar3[uVar5];
        local_d8 = dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.
                            m_data[0] - local_80);
        dStack_d0 = dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot
                             .m_data[1] - local_78);
        local_c8 = dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot.
                            m_data[2] - local_70);
        local_c0 = (ChVectorRef *)
                   (dVar6 * ((pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.rot
                             .m_data[3] - local_68));
        (**(code **)(*(long *)&(pCVar1->super_ChParticleBase).super_ChFrameMoving<double>.
                               super_ChFrame<double> + 0x68))
                  (pCVar1,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                           *)&local_d8);
      }
      uVar5 = (ulong)uVar4;
      ppCVar3 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void ChParticleCloud::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        ChCoordsys<> old_coord_dt = particles[j]->GetCoord_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        particles[j]->SetPos_dt(particles[j]->variables.Get_qb().segment(0, 3));
        particles[j]->SetWvel_loc(particles[j]->variables.Get_qb().segment(3, 3));

        // apply limits (if in speed clamping mode) to speeds.
        // ClampSpeed(); NO - do only per-particle, here.. (but.. really needed here?)

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            particles[j]->SetPos_dtdt((particles[j]->GetCoord_dt().pos - old_coord_dt.pos) / step);
            particles[j]->SetRot_dtdt((particles[j]->GetCoord_dt().rot - old_coord_dt.rot) / step);
        }
    }
}